

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

uint64_t __thiscall fmp4_stream::emsg::size(emsg *this)

{
  long lVar1;
  long lVar2;
  size_type sVar3;
  uint64_t local_18;
  uint64_t l_size;
  emsg *this_local;
  
  local_18 = full_box::size(&this->super_full_box);
  if ((this->super_full_box).super_box.field_0x62 == '\x01') {
    local_18 = local_18 + 4;
  }
  lVar1 = std::__cxx11::string::size();
  lVar2 = std::__cxx11::string::size();
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
  return sVar3 + lVar2 + lVar1 + local_18 + 0x12;
}

Assistant:

uint64_t emsg::size() const
	{
		uint64_t l_size = full_box::size();
		if (version_ == 1)
			l_size += 4;
		l_size += 16; // presentation time duration
		l_size += scheme_id_uri_.size() + 1;
		l_size += value_.size() + 1;
		l_size += message_data_.size();
		return l_size;
	}